

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void __thiscall node::first_instruction(node *this)

{
  pointer pbVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  string sStack_48;
  
  this->no_code = false;
  lVar4 = 0;
  uVar3 = 0;
  while( true ) {
    pbVar1 = (this->inputCode).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->inputCode).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar3) {
      this->pc = '\0';
      this->no_code = true;
      return;
    }
    std::__cxx11::string::string
              ((string *)&sStack_48,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4));
    bVar2 = is_whitespace(&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
    if (!bVar2) break;
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 0x20;
  }
  this->pc = (int8_t)uVar3;
  return;
}

Assistant:

void node::first_instruction(){
  no_code=false;
  for(int i=0;i<inputCode.size();i++){
    if(!is_whitespace(inputCode[i])){
      pc=i;
      return;
    }
  }
  pc=0;
  no_code=true;
  return;
}